

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::paren_expression(Node *__return_storage_ptr__,Parser *this)

{
  ostream *poVar1;
  Node local_50;
  
  __return_storage_ptr__->_if = false;
  __return_storage_ptr__->_else = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->lexer).lexem.type == OPAR) {
    nextLexem(this);
    expression(&local_50,this);
    Node::operator=(__return_storage_ptr__,&local_50);
    Node::~Node(&local_50);
    if ((this->lexer).lexem.type == CPAR) {
      nextLexem(this);
      return __return_storage_ptr__;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"\")\" expected");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"\"(\" expected");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  exit(0);
}

Assistant:

Node Parser::paren_expression() {
    Node parenExpNode;
    if (getLexemType() != OPAR) {
        cout << "\"(\" expected" << endl;
        exit(0);
    }
    nextLexem();
    parenExpNode = expression();
    if (getLexemType() != CPAR) {
        cout << "\")\" expected" << endl;
        exit(0);
    }
    nextLexem();
    return parenExpNode;
}